

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O0

void helicsAppFinalize(HelicsApp app,HelicsError *err)

{
  App *pAVar1;
  App *happ;
  HelicsError *in_stack_ffffffffffffffe0;
  HelicsApp in_stack_ffffffffffffffe8;
  
  pAVar1 = getApp(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pAVar1 != (App *)0x0) {
    (*pAVar1->_vptr_App[5])();
  }
  return;
}

Assistant:

void helicsAppFinalize(HelicsApp app, HelicsError* err)
{
    auto* happ = getApp(app, err);
    if (happ == nullptr) {
        return;
    }
    try {
        happ->finalize();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}